

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O0

int size_lookup(char *name)

{
  bool bVar1;
  char *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  int size;
  int local_20;
  int local_18;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (size_table[local_14].name == (char *)0x0) {
      return -1;
    }
    if ((*in_RDI < 'A') || ('Z' < *in_RDI)) {
      local_18 = (int)*in_RDI;
    }
    else {
      local_18 = *in_RDI + 0x20;
    }
    if ((*size_table[local_14].name < 'A') || ('Z' < *size_table[local_14].name)) {
      local_20 = (int)*size_table[local_14].name;
    }
    else {
      local_20 = *size_table[local_14].name + 0x20;
    }
    if ((local_18 == local_20) && (bVar1 = str_prefix(in_stack_00000008,unaff_retaddr), !bVar1))
    break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int size_lookup(const char *name)
{
	int size;

	for (size = 0; size_table[size].name != nullptr; size++)
	{
		if (LOWER(name[0]) == LOWER(size_table[size].name[0]) && !str_prefix(name, size_table[size].name))
			return size;
	}

	return -1;
}